

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.h
# Opt level: O1

void __thiscall asmjit::X86RAPass::loadState(X86RAPass *this,RAState *src_)

{
  byte bVar1;
  ushort uVar2;
  void *pvVar3;
  VirtReg *pVVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong unaff_RBX;
  ulong unaff_RBP;
  X86RAState *src;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  
code_r0x00126470:
  pvVar3 = (this->super_RAPass)._contextVd.super_ZoneVectorBase._data;
  uVar6 = (ulong)(uint)(this->super_RAPass)._contextVd.super_ZoneVectorBase._length;
  uVar7 = (ulong)(this->_regCount).field_0.field_0._gp;
  if (uVar7 != 0) {
    uVar11 = (uint)*(ushort *)(src_ + 0x148);
    uVar13 = 0;
    do {
      pVVar4 = *(VirtReg **)(src_ + uVar13 * 8);
      (this->_x86State).field_0._list[uVar13] = pVVar4;
      if (pVVar4 != (VirtReg *)0x0) {
        pVVar4->_state = '\x01';
        pVVar4->_physId = (uint8_t)uVar13;
        pVVar4->_modified = (byte)uVar11 & 1;
      }
      uVar13 = uVar13 + 1;
      uVar11 = uVar11 >> 1;
    } while (uVar7 != uVar13);
  }
  uVar7 = (ulong)(this->_regCount).field_0.field_0._mm;
  if (uVar7 != 0) {
    uVar11 = (uint)(byte)src_[0x14a];
    uVar13 = 0;
    do {
      lVar5 = *(long *)(src_ + uVar13 * 8 + 0x80);
      *(long *)((long)&(this->_x86State).field_0 + uVar13 * 8 + 0x80) = lVar5;
      if (lVar5 != 0) {
        *(undefined1 *)(lVar5 + 0x24) = 1;
        *(char *)(lVar5 + 0x25) = (char)uVar13;
        *(byte *)(lVar5 + 0x26) = (byte)uVar11 & 1;
      }
      uVar13 = uVar13 + 1;
      uVar11 = uVar11 >> 1;
    } while (uVar7 != uVar13);
  }
  uVar7 = (ulong)(this->_regCount).field_0.field_0._vec;
  if (uVar7 != 0) {
    uVar11 = *(uint *)(src_ + 0x14c);
    uVar13 = 0;
    do {
      lVar5 = *(long *)(src_ + uVar13 * 8 + 0xc0);
      *(long *)((long)&(this->_x86State).field_0 + uVar13 * 8 + 0xc0) = lVar5;
      if (lVar5 != 0) {
        *(undefined1 *)(lVar5 + 0x24) = 1;
        *(char *)(lVar5 + 0x25) = (char)uVar13;
        *(byte *)(lVar5 + 0x26) = (byte)uVar11 & 1;
      }
      uVar13 = uVar13 + 1;
      uVar11 = uVar11 >> 1;
    } while (uVar7 != uVar13);
  }
  (this->_x86State)._occupied.field_0 = *(anon_union_8_2_a70401ef_for_X86RegMask_0 *)(src_ + 0x140);
  (this->_x86State)._modified.field_0 = *(anon_union_8_2_a70401ef_for_X86RegMask_0 *)(src_ + 0x148);
  if (uVar6 != 0) {
    uVar7 = 0;
    do {
      if (((byte)src_[uVar7 + 0x150] & 3) != 1) {
        lVar5 = *(long *)((long)pvVar3 + uVar7 * 8);
        *(byte *)(lVar5 + 0x24) = (byte)src_[uVar7 + 0x150] & 3;
        *(undefined2 *)(lVar5 + 0x25) = 0xff;
      }
      uVar7 = uVar7 + 1;
    } while (uVar6 != uVar7);
  }
  *(ulong *)((long)register0x00000020 + -8) = unaff_RBP;
  *(ulong *)((long)register0x00000020 + -0x10) = unaff_RBX;
  *(void **)((long)register0x00000020 + -0x18) = pvVar3;
  uVar11 = (this->_regCount).field_0._packed;
  if ((uVar11 & 0xff) != 0) {
    uVar2 = (this->_x86State)._occupied.field_0.field_0._gp;
    src_ = (RAState *)(ulong)uVar2;
    uVar12 = 1;
    uVar6 = 0;
    do {
      pVVar4 = (this->_x86State).field_0._list[uVar6];
      uVar9 = (uint)(this->_x86State)._modified.field_0.field_0._gp;
      if (pVVar4 != (VirtReg *)0x0) {
        if ((uVar12 & uVar2) == 0) {
          *(undefined8 *)((long)register0x00000020 + -0x20) = 0x12640c;
          _checkState();
LAB_0012640c:
          *(undefined8 *)((long)register0x00000020 + -0x20) = 0x126411;
          _checkState();
LAB_00126411:
          *(undefined8 *)((long)register0x00000020 + -0x20) = 0x126416;
          _checkState();
LAB_00126416:
          *(undefined8 *)((long)register0x00000020 + -0x20) = 0x12641b;
          _checkState();
        }
        else {
          uVar8 = (uint)(pVVar4->_modified != '\0') << ((byte)uVar6 & 0x1f);
          unaff_RBX = (ulong)uVar8;
          if ((uVar12 & uVar9) != uVar8) goto LAB_0012640c;
          if (((pVVar4->_regInfo)._signature & 0xf00) != 0) goto LAB_00126411;
          if (pVVar4->_state != '\x01') goto LAB_00126416;
          if (uVar6 == pVVar4->_physId) goto LAB_001262be;
        }
        *(undefined8 *)((long)register0x00000020 + -0x20) = 0x126420;
        _checkState();
        goto LAB_00126420;
      }
      if ((uVar12 & uVar2) != 0) goto LAB_00126452;
      if ((uVar12 & uVar9) != 0) goto LAB_00126457;
LAB_001262be:
      uVar6 = uVar6 + 1;
      uVar12 = uVar12 * 2;
    } while (((ulong)uVar11 & 0xff) != uVar6);
  }
  if ((uVar11 >> 0x10 & 0xff) != 0) {
    bVar1 = (this->_x86State)._occupied.field_0.field_0._mm;
    src_ = (RAState *)(ulong)bVar1;
    uVar12 = 1;
    uVar6 = 0;
    do {
      lVar5 = *(long *)((long)&(this->_x86State).field_0 + uVar6 * 8 + 0x80);
      uVar9 = (uint)(this->_x86State)._modified.field_0.field_0._mm;
      if (lVar5 == 0) {
        if ((uVar12 & bVar1) != 0) goto LAB_0012645c;
        if ((uVar12 & uVar9) != 0) goto LAB_00126461;
      }
      else {
        if ((uVar12 & bVar1) == 0) goto LAB_00126420;
        uVar9 = uVar12 & uVar9;
        unaff_RBX = (ulong)uVar9;
        uVar8 = (uint)(*(char *)(lVar5 + 0x26) != '\0') << ((byte)uVar6 & 0x1f);
        unaff_RBP = (ulong)uVar8;
        if (uVar9 != uVar8) goto LAB_00126425;
        uVar9 = *(uint *)(lVar5 + 4) & 0xf00;
        unaff_RBX = (ulong)uVar9;
        if (uVar9 != 0x200) goto LAB_0012642a;
        if (*(char *)(lVar5 + 0x24) != '\x01') goto LAB_0012642f;
        if (uVar6 != *(byte *)(lVar5 + 0x25)) goto LAB_00126434;
      }
      uVar6 = uVar6 + 1;
      uVar12 = uVar12 * 2;
    } while ((byte)(uVar11 >> 0x10) != uVar6);
  }
  uVar11 = uVar11 >> 8 & 0xff;
  if (uVar11 == 0) {
    return;
  }
  uVar12 = (this->_x86State)._occupied.field_0.field_0._vec;
  uVar9 = (this->_x86State)._modified.field_0.field_0._vec;
  src_ = (RAState *)(ulong)uVar9;
  uVar8 = 1;
  uVar6 = 0;
  do {
    lVar5 = *(long *)((long)&(this->_x86State).field_0 + uVar6 * 8 + 0xc0);
    if (lVar5 == 0) {
      if ((uVar8 & uVar12) != 0) goto LAB_00126466;
      if ((uVar8 & uVar9) != 0) goto LAB_0012646b;
    }
    else {
      if ((uVar8 & uVar12) == 0) goto LAB_00126439;
      uVar10 = (uint)(*(char *)(lVar5 + 0x26) != '\0') << ((byte)uVar6 & 0x1f);
      unaff_RBX = (ulong)uVar10;
      if ((uVar8 & uVar9) != uVar10) goto LAB_0012643e;
      if ((*(uint *)(lVar5 + 4) & 0xf00) != 0x100) goto LAB_00126443;
      if (*(char *)(lVar5 + 0x24) != '\x01') goto LAB_00126448;
      if (uVar6 != *(byte *)(lVar5 + 0x25)) goto LAB_0012644d;
    }
    uVar6 = uVar6 + 1;
    uVar8 = uVar8 * 2;
    if (uVar11 == uVar6) {
      return;
    }
  } while( true );
LAB_00126420:
  *(undefined8 *)((long)register0x00000020 + -0x20) = 0x126425;
  _checkState();
LAB_00126425:
  *(undefined8 *)((long)register0x00000020 + -0x20) = 0x12642a;
  _checkState();
LAB_0012642a:
  *(undefined8 *)((long)register0x00000020 + -0x20) = 0x12642f;
  _checkState();
LAB_0012642f:
  *(undefined8 *)((long)register0x00000020 + -0x20) = 0x126434;
  _checkState();
LAB_00126434:
  *(undefined8 *)((long)register0x00000020 + -0x20) = 0x126439;
  _checkState();
LAB_00126439:
  *(undefined8 *)((long)register0x00000020 + -0x20) = 0x12643e;
  _checkState();
LAB_0012643e:
  *(undefined8 *)((long)register0x00000020 + -0x20) = 0x126443;
  _checkState();
LAB_00126443:
  *(undefined8 *)((long)register0x00000020 + -0x20) = 0x126448;
  _checkState();
LAB_00126448:
  *(undefined8 *)((long)register0x00000020 + -0x20) = 0x12644d;
  _checkState();
LAB_0012644d:
  *(undefined8 *)((long)register0x00000020 + -0x20) = 0x126452;
  _checkState();
LAB_00126452:
  *(undefined8 *)((long)register0x00000020 + -0x20) = 0x126457;
  _checkState();
LAB_00126457:
  *(undefined8 *)((long)register0x00000020 + -0x20) = 0x12645c;
  _checkState();
LAB_0012645c:
  *(undefined8 *)((long)register0x00000020 + -0x20) = 0x126461;
  _checkState();
LAB_00126461:
  *(undefined8 *)((long)register0x00000020 + -0x20) = 0x126466;
  _checkState();
LAB_00126466:
  *(undefined8 *)((long)register0x00000020 + -0x20) = 0x12646b;
  _checkState();
LAB_0012646b:
  *(code **)((long)register0x00000020 + -0x20) = loadState;
  _checkState();
  register0x00000020 = (BADSPACEBASE *)((long)register0x00000020 + -0x18);
  goto code_r0x00126470;
}

Assistant:

ASMJIT_INLINE T* getData() noexcept { return static_cast<T*>(_data); }